

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

int glu::TextureTestUtil::computeTextureLookupDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,Texture1DView *baseView,float *texCoord,
              ReferenceParams *sampleParams,LookupPrecision *lookupPrec,LodPrecision *lodPrec,
              qpWatchDog *watchDog)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  int iVar4;
  int y_;
  uint uVar5;
  float *pfVar6;
  float width;
  float fVar7;
  float fVar8;
  float fVar9;
  float coord_00;
  float fVar10;
  Texture1DView TVar11;
  float local_29c;
  float local_268;
  Vec4 local_230;
  undefined1 local_21d;
  bool isOk;
  Vec2 local_214;
  Vec2 local_20c;
  Vec2 clampedLod;
  Vec2 lodO;
  float coordDyo;
  float coordDxo;
  float nyo;
  float nxo;
  float wyo;
  float wxo;
  int lodOffsNdx;
  Vec2 lodBounds;
  float coordDy;
  float coordDx;
  float coord;
  float triNy;
  float triNx;
  float triWy;
  float triWx;
  int triNdx;
  float ny;
  float nx;
  float wy;
  float wx;
  Vector<float,_4> local_198;
  Vector<bool,_4> local_188;
  undefined1 local_184 [16];
  Vector<float,_4> local_174;
  undefined1 local_164 [8];
  Vec4 refPix;
  Vector<float,_4> local_144;
  undefined1 local_134 [8];
  Vec4 resPix;
  int px;
  int py;
  Vector<float,_2> local_108;
  Vec2 lodOffsets [4];
  int numFailed;
  Vec2 lodBias;
  Vec3 triW [2];
  undefined1 local_b8 [8];
  Vec3 triS [2];
  int srcSize;
  float dstH;
  float dstW;
  IVec2 dstSize;
  Vec4 sq;
  Texture1DView local_70;
  undefined1 local_60 [8];
  Texture1DView src;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  ReferenceParams *sampleParams_local;
  float *texCoord_local;
  Texture1DView *baseView_local;
  PixelBufferAccess *errorMask_local;
  ConstPixelBufferAccess *reference_local;
  ConstPixelBufferAccess *result_local;
  
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::vector
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             &src.m_levels);
  TVar11 = getSubView(baseView,sampleParams->baseLevel,sampleParams->maxLevel);
  local_70.m_levels = TVar11.m_levels;
  local_70.m_numLevels = TVar11.m_numLevels;
  TVar11 = tcu::getEffectiveTextureView
                     (&local_70,
                      (vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                       *)&src.m_levels,&sampleParams->sampler);
  src._0_8_ = TVar11.m_levels;
  local_60._0_4_ = TVar11.m_numLevels;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)&dstSize,*texCoord,texCoord[1],texCoord[2],texCoord[3]);
  iVar4 = tcu::ConstPixelBufferAccess::getWidth(result);
  y_ = tcu::ConstPixelBufferAccess::getHeight(result);
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&dstH,iVar4,y_);
  iVar4 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&dstH);
  width = (float)iVar4;
  iVar4 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&dstH);
  triS[1].m_data[2] = (float)iVar4;
  triS[1].m_data[1] = (float)tcu::Texture1DView::getWidth((Texture1DView *)local_60);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_b8,(int)&dstSize,0,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)(triS[0].m_data + 1),(int)&dstSize,3,2);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)&lodBias,(int)sampleParams + 0xc,0,1);
  tcu::Vector<float,_4>::swizzle
            ((Vector<float,_4> *)(triW[0].m_data + 1),(int)sampleParams + 0xc,3,2);
  if (((sampleParams->super_RenderParams).flags & 2) == 0) {
    local_268 = 0.0;
  }
  else {
    local_268 = (sampleParams->super_RenderParams).bias;
  }
  tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&stack0xffffffffffffff20,local_268);
  lodOffsets[3].m_data[1] = 0.0;
  tcu::Vector<float,_2>::Vector(&local_108,-1.0,0.0);
  tcu::Vector<float,_2>::Vector(lodOffsets,1.0,0.0);
  tcu::Vector<float,_2>::Vector(lodOffsets + 1,0.0,-1.0);
  tcu::Vector<float,_2>::Vector(lodOffsets + 2,0.0,1.0);
  tcu::RGBA::green();
  tcu::RGBA::toVec((RGBA *)&py);
  tcu::clear(errorMask,(Vec4 *)&py);
  for (resPix.m_data[3] = 0.0; fVar1 = resPix.m_data[3],
      iVar4 = tcu::ConstPixelBufferAccess::getHeight(result), fVar2 = lodOffsets[3].m_data[1],
      (int)fVar1 < iVar4; resPix.m_data[3] = (float)((int)resPix.m_data[3] + 1)) {
    if (watchDog != (qpWatchDog *)0x0) {
      qpWatchDog_touch(watchDog);
    }
    for (resPix.m_data[2] = 0.0; fVar1 = resPix.m_data[2],
        iVar4 = tcu::ConstPixelBufferAccess::getWidth(result), (int)fVar1 < iVar4;
        resPix.m_data[2] = (float)((int)resPix.m_data[2] + 1)) {
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)(refPix.m_data + 2),(int)result,(int)resPix.m_data[2],
                 (int)resPix.m_data[3]);
      tcu::operator-((tcu *)&local_144,(Vector<float,_4> *)(refPix.m_data + 2),
                     &(sampleParams->super_RenderParams).colorBias);
      tcu::operator/((tcu *)local_134,&local_144,&(sampleParams->super_RenderParams).colorScale);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_184,(int)reference,(int)resPix.m_data[2],
                 (int)resPix.m_data[3]);
      tcu::operator-((tcu *)&local_174,(Vector<float,_4> *)local_184,
                     &(sampleParams->super_RenderParams).colorBias);
      tcu::operator/((tcu *)local_164,&local_174,&(sampleParams->super_RenderParams).colorScale);
      tcu::operator-((tcu *)&wy,(Vector<float,_4> *)local_134,(Vector<float,_4> *)local_164);
      tcu::abs<float,4>((tcu *)&local_198,(Vector<float,_4> *)&wy);
      tcu::lessThanEqual<float,4>((tcu *)&local_188,&local_198,&lookupPrec->colorThreshold);
      bVar3 = tcu::boolAll<4>(&local_188);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        fVar7 = (float)(int)resPix.m_data[2] + 0.5;
        fVar8 = (float)(int)resPix.m_data[3] + 0.5;
        fVar9 = fVar7 / width;
        local_29c = fVar8 / triS[1].m_data[2];
        uVar5 = (uint)(1.0 <= fVar9 + local_29c);
        fVar1 = fVar8;
        fVar2 = fVar7;
        if (uVar5 != 0) {
          fVar9 = 1.0 - fVar9;
          local_29c = 1.0 - local_29c;
          fVar1 = triS[1].m_data[2] - fVar8;
          fVar2 = width - fVar7;
        }
        coord_00 = projectedTriInterpolate
                             ((Vec3 *)(triS[(long)(int)uVar5 + -1].m_data + 1),
                              (Vec3 *)((long)&lodBias + (long)(int)uVar5 * 0xc),fVar9,local_29c);
        fVar7 = triDerivateX((Vec3 *)(triS[(long)(int)uVar5 + -1].m_data + 1),
                             (Vec3 *)((long)&lodBias + (long)(int)uVar5 * 0xc),fVar7,width,local_29c
                            );
        lodBounds.m_data[1] = fVar7 * (float)(int)triS[1].m_data[1];
        fVar9 = triDerivateY((Vec3 *)(triS[(long)(int)uVar5 + -1].m_data + 1),
                             (Vec3 *)((long)&lodBias + (long)(int)uVar5 * 0xc),fVar8,
                             triS[1].m_data[2],fVar9);
        lodBounds.m_data[0] = fVar9 * (float)(int)triS[1].m_data[1];
        tcu::computeLodBoundsFromDerivates
                  ((tcu *)&wxo,lodBounds.m_data[1],lodBounds.m_data[0],lodPrec);
        for (wyo = 0.0; (int)wyo < 4; wyo = (float)((int)wyo + 1)) {
          fVar9 = tcu::Vector<float,_2>::x(lodOffsets + (long)(int)wyo + -1);
          fVar7 = tcu::Vector<float,_2>::y(lodOffsets + (long)(int)wyo + -1);
          fVar8 = triDerivateX((Vec3 *)(triS[(long)(int)uVar5 + -1].m_data + 1),
                               (Vec3 *)((long)&lodBias + (long)(int)uVar5 * 0xc),fVar2 + fVar9,width
                               ,(fVar1 + fVar7) / triS[1].m_data[2]);
          fVar10 = (float)(int)triS[1].m_data[1];
          fVar9 = triDerivateY((Vec3 *)(triS[(long)(int)uVar5 + -1].m_data + 1),
                               (Vec3 *)((long)&lodBias + (long)(int)uVar5 * 0xc),fVar1 + fVar7,
                               triS[1].m_data[2],(fVar2 + fVar9) / width);
          tcu::computeLodBoundsFromDerivates
                    ((tcu *)&clampedLod,fVar8 * fVar10,fVar9 * (float)(int)triS[1].m_data[1],lodPrec
                    );
          pfVar6 = tcu::Vector<float,_2>::x((Vector<float,_2> *)&wxo);
          fVar9 = *pfVar6;
          fVar7 = tcu::Vector<float,_2>::x(&clampedLod);
          fVar9 = de::min<float>(fVar9,fVar7);
          pfVar6 = tcu::Vector<float,_2>::x((Vector<float,_2> *)&wxo);
          *pfVar6 = fVar9;
          pfVar6 = tcu::Vector<float,_2>::y((Vector<float,_2> *)&wxo);
          fVar9 = *pfVar6;
          fVar7 = tcu::Vector<float,_2>::y(&clampedLod);
          fVar9 = de::max<float>(fVar9,fVar7);
          pfVar6 = tcu::Vector<float,_2>::y((Vector<float,_2> *)&wxo);
          *pfVar6 = fVar9;
        }
        tcu::operator+((tcu *)&local_214,(Vector<float,_2> *)&wxo,
                       (Vector<float,_2> *)&stack0xffffffffffffff20);
        tcu::Vector<float,_2>::Vector
                  ((Vector<float,_2> *)&stack0xfffffffffffffde4,sampleParams->minLod,
                   sampleParams->maxLod);
        tcu::clampLodBounds((tcu *)&local_20c,&local_214,(Vec2 *)&stack0xfffffffffffffde4,lodPrec);
        local_21d = tcu::isLookupResultValid
                              ((Texture1DView *)local_60,&sampleParams->sampler,lookupPrec,coord_00,
                               &local_20c,(Vec4 *)local_134);
        if (!(bool)local_21d) {
          tcu::RGBA::red();
          tcu::RGBA::toVec((RGBA *)&local_230);
          tcu::PixelBufferAccess::setPixel
                    (errorMask,&local_230,(int)resPix.m_data[2],(int)resPix.m_data[3],0);
          lodOffsets[3].m_data[1] = (float)((int)lodOffsets[3].m_data[1] + 1);
        }
      }
    }
  }
  std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>::~vector
            ((vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *)
             &src.m_levels);
  return (int)fVar2;
}

Assistant:

int computeTextureLookupDiff (const tcu::ConstPixelBufferAccess&	result,
							  const tcu::ConstPixelBufferAccess&	reference,
							  const tcu::PixelBufferAccess&			errorMask,
							  const tcu::Texture1DView&				baseView,
							  const float*							texCoord,
							  const ReferenceParams&				sampleParams,
							  const tcu::LookupPrecision&			lookupPrec,
							  const tcu::LodPrecision&				lodPrec,
							  qpWatchDog*							watchDog)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::Texture1DView					src					= getEffectiveTextureView(getSubView(baseView, sampleParams.baseLevel, sampleParams.maxLevel), srcLevelStorage, sampleParams.sampler);

	const tcu::Vec4								sq					= tcu::Vec4(texCoord[0], texCoord[1], texCoord[2], texCoord[3]);

	const tcu::IVec2							dstSize				= tcu::IVec2(result.getWidth(), result.getHeight());
	const float									dstW				= float(dstSize.x());
	const float									dstH				= float(dstSize.y());
	const int									srcSize				= src.getWidth();

	// Coordinates and lod per triangle.
	const tcu::Vec3								triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3								triW[2]				= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2								lodBias				((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	int											numFailed			= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		// Ugly hack, validation can take way too long at the moment.
		if (watchDog)
			qpWatchDog_touch(watchDog);

		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= (result.getPixel(px, py)		- sampleParams.colorBias) / sampleParams.colorScale;
			const tcu::Vec4	refPix	= (reference.getPixel(px, py)	- sampleParams.colorBias) / sampleParams.colorScale;

			// Try comparison to ideal reference first, and if that fails use slower verificator.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(resPix - refPix), lookupPrec.colorThreshold)))
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const int		triNdx	= nx + ny >= 1.0f ? 1 : 0;
				const float		triWx	= triNdx ? dstW - wx : wx;
				const float		triWy	= triNdx ? dstH - wy : wy;
				const float		triNx	= triNdx ? 1.0f - nx : nx;
				const float		triNy	= triNdx ? 1.0f - ny : ny;

				const float		coord		= projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy);
				const float		coordDx		= triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy) * float(srcSize);
				const float		coordDy		= triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx) * float(srcSize);

				tcu::Vec2		lodBounds	= tcu::computeLodBoundsFromDerivates(coordDx, coordDy, lodPrec);

				// Compute lod bounds across lodOffsets range.
				for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
				{
					const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
					const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
					const float		nxo		= wxo/dstW;
					const float		nyo		= wyo/dstH;

					const float	coordDxo	= triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo) * float(srcSize);
					const float	coordDyo	= triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo) * float(srcSize);
					const tcu::Vec2	lodO	= tcu::computeLodBoundsFromDerivates(coordDxo, coordDyo, lodPrec);

					lodBounds.x() = de::min(lodBounds.x(), lodO.x());
					lodBounds.y() = de::max(lodBounds.y(), lodO.y());
				}

				const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);
				const bool		isOk		= tcu::isLookupResultValid(src, sampleParams.sampler, lookupPrec, coord, clampedLod, resPix);

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}